

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  byte bVar1;
  unsigned_long srcSize;
  unsigned_long srcSize_00;
  void *__n;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  FILE *__stream;
  size_type __n_00;
  size_t sVar6;
  int *piVar7;
  float ***pppfVar8;
  float **ppfVar9;
  int **ppiVar10;
  int *piVar11;
  float *pfVar12;
  size_t sVar13;
  char **ppcVar14;
  char *pcVar15;
  undefined4 uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  long lVar26;
  ulong uVar27;
  undefined8 uVar28;
  uchar *src;
  long lVar29;
  pointer paVar30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<float,_std::allocator<float>_> image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<int,_std::allocator<int>_> channelOffsetList;
  vector<char,_std::allocator<char>_> buf;
  uint local_164;
  vector<int,_std::allocator<int>_> local_158;
  uint local_140;
  allocator_type local_139;
  string local_138;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  size_t local_e8;
  pointer local_e0;
  string local_d8;
  size_type local_b8;
  int *local_b0;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_a8;
  void *local_88 [2];
  long local_78;
  size_t local_70;
  ulong local_68;
  long local_60;
  int *local_58;
  ulong local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar15 = "Invalid argument.";
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar15 = "Cannot read file.";
    }
    else {
      fseek(__stream,0,2);
      __n_00 = ftell(__stream);
      fseek(__stream,0,0);
      if (__n_00 != 0) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_48,__n_00,(allocator_type *)&local_138);
        sVar6 = fread(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,1,__n_00,__stream);
        if (sVar6 != __n_00) {
          __assert_fail("ret == filesize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                        ,0x27eb,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        fclose(__stream);
        iVar17 = *(int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        if (iVar17 == 0x1312f76) {
          piVar11 = (int *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start + 4);
        }
        else {
          piVar11 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
          if (err != (char **)0x0) {
            *err = "Header mismatch.";
          }
        }
        iVar21 = -3;
        if (iVar17 == 0x1312f76) {
          if (((((char)*piVar11 == '\x02') && (*(char *)((long)piVar11 + 1) == '\b')) &&
              (*(char *)((long)piVar11 + 2) == '\0')) && (*(char *)((long)piVar11 + 3) == '\0')) {
            local_b0 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start;
            piVar11 = piVar11 + 1;
            local_a8.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_108 = CONCAT44(local_108._4_4_,1);
            iVar17 = -1;
            local_110 = 0xffffffff;
            local_118 = CONCAT44(local_118._4_4_,0xffffffff);
            local_e8 = CONCAT44(local_e8._4_4_,0xffffffff);
            local_164 = 0xffffffff;
            local_e0 = (pointer)CONCAT44(local_e0._4_4_,0xffffffff);
            do {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              local_138._M_string_length = 0;
              local_138.field_2._M_local_buf[0] = '\0';
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              local_d8._M_string_length = 0;
              local_d8.field_2._M_local_buf[0] = '\0';
              uVar28 = 0;
              local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              piVar7 = (int *)anon_unknown.dwarf_57b15::ReadAttribute
                                        (&local_138,&local_d8,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &local_158,(char *)piVar11);
              if (piVar7 == (int *)0x0) {
                piVar11 = (int *)((long)piVar11 + 1);
                iVar4 = 2;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_138);
                if (iVar4 == 0) {
                  bVar1 = (byte)*local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  if (bVar1 < 4) {
                    uVar16 = (int)local_108;
                    if (bVar1 == 3) {
                      uVar16 = 0x10;
                    }
                    local_108 = CONCAT44(local_108._4_4_,uVar16);
                    local_e0 = (pointer)CONCAT44(local_e0._4_4_,(uint)bVar1);
LAB_00163121:
                    iVar4 = 0;
                    piVar11 = piVar7;
                  }
                  else {
                    iVar21 = -5;
                    iVar4 = 1;
                    if (err != (char **)0x0) {
                      pcVar15 = "Unsupported compression type.";
LAB_00163140:
                      iVar4 = 1;
                      *err = pcVar15;
                    }
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar4 != 0) {
                    iVar4 = std::__cxx11::string::compare((char *)&local_138);
                    if (iVar4 == 0) {
                      uVar20 = (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start;
                      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish !=
                          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
                        if (uVar20 < 5) {
                          uVar28 = 4;
                        }
                        else if (uVar20 < 9) {
                          uVar28 = 8;
                        }
                        else {
                          if (0xc < uVar20) {
                            local_e8 = CONCAT44(local_e8._4_4_,
                                                *local_158.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start);
                            local_118 = CONCAT44(local_118._4_4_,
                                                 *(undefined4 *)
                                                  ((long)local_158.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4));
                            local_110 = (ulong)*(uint *)((long)local_158.
                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8);
                            iVar17 = *(int *)((long)local_158.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start + 0xc);
                            goto LAB_00163121;
                          }
                          uVar28 = 0xc;
                        }
                      }
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar28);
LAB_00163961:
                      uVar28 = 4;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_138);
                      if (iVar4 != 0) goto LAB_001630a4;
                      uVar20 = (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start;
                      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish !=
                          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
                        if (uVar20 < 5) goto LAB_00163961;
                        if (uVar20 < 9) {
                          uVar28 = 8;
                        }
                        else {
                          iVar4 = 0;
                          piVar11 = piVar7;
                          if (0xc < uVar20) goto LAB_00163148;
                          uVar28 = 0xc;
                        }
                      }
                    }
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar28);
                    goto LAB_00163988;
                  }
                  anon_unknown.dwarf_57b15::ReadChannelInfo
                            (&local_a8,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
                  local_164 = (int)((ulong)((long)local_a8.
                                                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_a8.
                                                 super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x55555555;
                  if ((int)local_164 < 1) {
                    iVar21 = -6;
                    iVar4 = 1;
                    if (err != (char **)0x0) {
                      pcVar15 = "Invalid channels format.";
                      goto LAB_00163140;
                    }
                  }
                  else {
LAB_001630a4:
                    iVar4 = 0;
                    piVar11 = piVar7;
                  }
                }
              }
LAB_00163148:
              if ((byte *)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start != (byte *)0x0) {
                operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,
                                CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                         local_d8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                         local_138.field_2._M_local_buf[0]) + 1);
              }
            } while (iVar4 == 0);
            if (iVar4 == 2) {
              if ((int)local_e8 < 0) {
LAB_00163988:
                __assert_fail("dx >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2865,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if ((int)local_118 < 0) {
                __assert_fail("dy >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2866,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if ((int)local_110 < 0) {
                __assert_fail("dw >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2867,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if (iVar17 < 0) {
                __assert_fail("dh >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2868,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if ((int)local_164 < 1) {
                __assert_fail("numChannels >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2869,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              uVar5 = (int)local_110 - (int)local_e8;
              local_110 = (ulong)uVar5;
              uVar5 = uVar5 + 1;
              iVar17 = iVar17 - (int)local_118;
              uVar22 = iVar17 + 1;
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_138,
                         (long)(int)(uVar22 * uVar5 * 4),(allocator_type *)&local_d8);
              uVar23 = (uint)((int)local_108 * ((int)uVar22 / (int)local_108) <= iVar17) +
                       (int)uVar22 / (int)local_108;
              local_140 = uVar22;
              std::vector<long_long,_std::allocator<long_long>_>::vector
                        ((vector<long_long,_std::allocator<long_long>_> *)&local_d8,
                         (long)(int)uVar23,(allocator_type *)&local_158);
              if (0 < (int)uVar23) {
                uVar20 = 0;
                do {
                  *(undefined8 *)(local_d8._M_dataplus._M_p + uVar20 * 8) =
                       *(undefined8 *)(piVar11 + uVar20 * 2);
                  uVar20 = uVar20 + 1;
                } while (uVar23 != uVar20);
              }
              if (((uint)local_e0 < 4) && ((uint)local_e0 != 1)) {
                local_50 = (ulong)local_164;
                local_70 = local_50 * 8;
                local_118 = (ulong)uVar5;
                pppfVar8 = (float ***)malloc(local_70);
                deepImage->image = pppfVar8;
                lVar29 = (long)(int)local_140;
                uVar20 = 1;
                if (1 < (int)local_164) {
                  uVar20 = (ulong)local_164;
                }
                uVar27 = 0;
                do {
                  ppfVar9 = (float **)malloc(lVar29 << 3);
                  deepImage->image[uVar27] = ppfVar9;
                  uVar27 = uVar27 + 1;
                } while (uVar20 != uVar27);
                ppiVar10 = (int **)malloc(lVar29 << 3);
                deepImage->offset_table = ppiVar10;
                local_b8 = (size_type)(int)local_118;
                if (-1 < iVar17) {
                  sVar6 = local_b8 * 4;
                  uVar27 = (ulong)local_140;
                  uVar20 = 0;
                  do {
                    piVar11 = (int *)malloc(sVar6);
                    deepImage->offset_table[uVar20] = piVar11;
                    uVar20 = uVar20 + 1;
                  } while (uVar27 != uVar20);
                }
                if (0 < (int)uVar23) {
                  local_60 = (long)(int)local_110;
                  local_108 = 1;
                  if (1 < (int)local_164) {
                    local_108 = (ulong)local_164;
                  }
                  local_e0 = local_a8.
                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_58 = &(local_a8.
                               super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->pixelType;
                  uVar20 = 0;
                  piVar11 = local_b0;
                  local_68 = (ulong)uVar23;
                  do {
                    lVar29 = *(long *)(local_d8._M_dataplus._M_p + uVar20 * 8);
                    srcSize = *(unsigned_long *)((long)piVar11 + lVar29 + 4);
                    srcSize_00 = *(unsigned_long *)((long)piVar11 + lVar29 + 0xc);
                    __n = *(void **)((long)piVar11 + lVar29 + 0x14);
                    std::vector<int,_std::allocator<int>_>::vector
                              (&local_158,local_b8,(allocator_type *)&local_100);
                    local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish +
                                  -(long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
                    if (local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start == (byte *)0x0) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
LAB_001638cb:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
LAB_001638dd:
                      __assert_fail("dstLen == (unsigned long)unpackedSampleDataSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                    ,0x28c5,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    src = (uchar *)((long)piVar11 + lVar29 + 0x1c);
                    anon_unknown.dwarf_57b15::DecompressZip
                              ((uchar *)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)&local_100,src,srcSize);
                    if (local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start !=
                        (byte *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish +
                                -(long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start)) {
                      __assert_fail("dstLen == pixelOffsetTable.size() * sizeof(int)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                    ,0x28b7,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    if (-1 < (int)local_110) {
                      piVar11 = deepImage->offset_table[uVar20];
                      uVar27 = 0;
                      do {
                        piVar11[uVar27] =
                             *(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + uVar27 * 4);
                        uVar27 = uVar27 + 1;
                      } while (local_118 != uVar27);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&local_100,(size_type)__n,(allocator_type *)local_88);
                    local_88[0] = __n;
                    if (local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) goto LAB_001638cb;
                    anon_unknown.dwarf_57b15::DecompressZip
                              (local_100.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)local_88,
                               src + srcSize,srcSize_00);
                    if (local_88[0] != __n) goto LAB_001638dd;
                    std::vector<int,_std::allocator<int>_>::vector
                              ((vector<int,_std::allocator<int>_> *)local_88,local_50,&local_139);
                    uVar27 = 0;
                    uVar18 = 0;
                    piVar11 = local_58;
                    do {
                      *(int *)((long)local_88[0] + uVar27 * 4) = (int)uVar18;
                      if (2 < (ulong)(uint)*piVar11) {
LAB_0016385a:
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                      ,0x28d6,
                                      "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                      }
                      uVar18 = (long)(int)uVar18 +
                               (long)*(int *)(&DAT_001a50e8 + (ulong)(uint)*piVar11 * 4);
                      uVar27 = uVar27 + 1;
                      piVar11 = piVar11 + 0xc;
                    } while (local_108 != uVar27);
                    if ((int)uVar18 < 2) {
                      __assert_fail("sampleSize >= 2",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                    ,0x28db,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    if ((long)local_100.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_100.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start !=
                        (long)*(int *)((long)local_158.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      local_60 * 4) * uVar18) {
                      __assert_fail("(size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size()"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                    ,0x28dd,
                                    "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                    }
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = uVar18 & 0xffffffff;
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = (long)local_100.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_100.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                    lVar29 = SUB168(auVar3 / auVar2,0) << 0x20;
                    sVar6 = lVar29 >> 0x1e;
                    local_e8 = lVar29 >> 0x1f;
                    iVar17 = SUB164(auVar3 / auVar2,0);
                    lVar29 = (long)iVar17;
                    uVar27 = 0;
                    uVar18 = 0;
                    do {
                      pfVar12 = (float *)malloc(sVar6);
                      deepImage->image[uVar27][uVar20] = pfVar12;
                      sVar13 = sVar6;
                      if (local_e0[uVar27].pixelType == 0) {
                        if (0 < iVar17) {
                          lVar19 = 0;
                          lVar26 = 0;
                          do {
                            if ((ulong)((long)local_100.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_100.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) <=
                                uVar18 + lVar19) goto LAB_0016384c;
                            *(float *)((long)deepImage->image[uVar27][uVar20] + lVar19) =
                                 (float)*(uint *)(local_100.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar19 + uVar18);
                            lVar26 = lVar26 + 1;
                            lVar19 = lVar19 + 4;
                          } while (lVar26 < lVar29);
                        }
                      }
                      else if (local_e0[uVar27].pixelType == 1) {
                        sVar13 = local_e8;
                        if (0 < iVar17) {
                          lVar19 = 0;
                          lVar26 = 0;
                          uVar24 = uVar18;
                          do {
                            if ((ulong)((long)local_100.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_100.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) <= uVar24) {
                              std::__throw_out_of_range_fmt
                                        (
                                        "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        );
LAB_0016383e:
                              std::__throw_out_of_range_fmt
                                        (
                                        "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        );
LAB_0016384c:
                              std::__throw_out_of_range_fmt
                                        (
                                        "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        );
                              goto LAB_0016385a;
                            }
                            uVar5 = (uint)*(ushort *)
                                           (local_100.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar24) <<
                                    0xd;
                            if ((uVar5 & 0xf800000) == 0xf800000) {
                              fVar25 = (float)(uVar5 | 0x70000000);
                            }
                            else if ((uVar5 & 0xf800000) == 0) {
                              fVar25 = (float)(uVar5 | 0x38800000) + -6.1035156e-05;
                            }
                            else {
                              fVar25 = (float)((uVar5 & 0xfffe000) + 0x38000000);
                            }
                            *(uint *)((long)deepImage->image[uVar27][uVar20] + lVar19) =
                                 (int)(short)*(ushort *)
                                              (local_100.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start + uVar24) &
                                 0x80000000U | (uint)fVar25;
                            lVar26 = lVar26 + 1;
                            lVar19 = lVar19 + 4;
                            uVar24 = uVar24 + 2;
                          } while (lVar26 < lVar29);
                        }
                      }
                      else if (0 < iVar17) {
                        lVar19 = 0;
                        lVar26 = 0;
                        do {
                          if ((ulong)((long)local_100.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_100.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start) <=
                              uVar18 + lVar19) goto LAB_0016383e;
                          *(undefined4 *)((long)deepImage->image[uVar27][uVar20] + lVar19) =
                               *(undefined4 *)
                                (local_100.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar19 + uVar18);
                          lVar26 = lVar26 + 1;
                          lVar19 = lVar19 + 4;
                        } while (lVar26 < lVar29);
                      }
                      uVar18 = uVar18 + sVar13;
                      uVar27 = uVar27 + 1;
                    } while (uVar27 != local_108);
                    if (local_88[0] != (void *)0x0) {
                      operator_delete(local_88[0],local_78 - (long)local_88[0]);
                    }
                    uVar27 = local_68;
                    piVar11 = local_b0;
                    if (local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
                      operator_delete(local_100.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_100.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_100.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((byte *)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start != (byte *)0x0) {
                      operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != uVar27);
                }
                deepImage->width = (int)local_118;
                deepImage->height = local_140;
                ppcVar14 = (char **)malloc(local_70);
                deepImage->channel_names = ppcVar14;
                uVar20 = 1;
                if (1 < (int)local_164) {
                  uVar20 = (ulong)local_164;
                }
                uVar27 = 0;
                paVar30 = local_a8.
                          super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pcVar15 = strdup((paVar30->name)._M_dataplus._M_p);
                  deepImage->channel_names[uVar27] = pcVar15;
                  uVar27 = uVar27 + 1;
                  paVar30 = paVar30 + 1;
                } while (uVar20 != uVar27);
                deepImage->num_channels = local_164;
                iVar21 = 0;
              }
              else {
                iVar21 = -10;
                if (err != (char **)0x0) {
                  *err = "Unsupported format.";
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_d8._M_dataplus._M_p,
                                CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                         local_d8.field_2._M_local_buf[0]) -
                                (long)local_d8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_138._M_dataplus._M_p,
                                CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                         local_138.field_2._M_local_buf[0]) -
                                (long)local_138._M_dataplus._M_p);
              }
            }
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector(&local_a8);
          }
          else {
            iVar21 = -4;
            if (err != (char **)0x0) {
              *err = "Unsupported version or scanline.";
            }
          }
        }
        if ((int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start == (int *)0x0) {
          return iVar21;
        }
        operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return iVar21;
      }
      fclose(__stream);
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar15 = "File size is zero.";
    }
  }
  *err = pcVar15;
  return -1;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}